

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::RegisterOptionsByIp(DnsStats *this,uint8_t *source_addr,size_t source_addr_length)

{
  uint8_t uVar1;
  uint8_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  ushort option_code;
  uint uStack_94;
  bool should_export;
  uint16_t o_length;
  uint16_t o_code;
  uint32_t current_index;
  bool stored;
  StatsByIP *local_80;
  StatsByIP *y;
  StatsByIP x;
  size_t source_addr_length_local;
  uint8_t *source_addr_local;
  DnsStats *this_local;
  
  x.option_mask = source_addr_length;
  StatsByIP::StatsByIP((StatsByIP *)&y,source_addr,source_addr_length,false,false,false,false);
  local_80 = BinHash<StatsByIP>::Retrieve(&this->statsByIp,(StatsByIP *)&y);
  if (local_80 == (StatsByIP *)0x0) {
    uVar4 = BinHash<StatsByIP>::GetCount(&this->statsByIp);
    if (uVar4 < this->max_stats_by_ip_count) {
      o_code._1_1_ = 0;
      local_80 = BinHash<StatsByIP>::InsertOrAdd
                           (&this->statsByIp,(StatsByIP *)&y,true,(bool *)((long)&o_code + 1));
      if (local_80 != (StatsByIP *)0x0) {
        local_80->query_seen = true;
      }
    }
  }
  else if ((local_80->query_seen & 1U) == 0) {
    local_80->count = local_80->count + 1;
    local_80->query_seen = true;
  }
  if (((local_80 != (StatsByIP *)0x0) && ((this->is_using_edns & 1U) != 0)) &&
     (this->edns_options != (uint8_t *)0x0)) {
    for (uStack_94 = 0; uStack_94 + 4 <= this->edns_options_length;
        uStack_94 = CONCAT11(uVar1,uVar2) + 4 + uStack_94) {
      option_code = CONCAT11(this->edns_options[uStack_94],this->edns_options[uStack_94 + 1]);
      uVar1 = this->edns_options[uStack_94 + 2];
      uVar2 = this->edns_options[uStack_94 + 3];
      bVar3 = StatsByIP::RegisterNewOption(local_80,option_code);
      if (bVar3) {
        SubmitRegistryNumber(this,0x2d,(uint)option_code);
      }
    }
  }
  StatsByIP::~StatsByIP((StatsByIP *)&y);
  return;
}

Assistant:

void DnsStats::RegisterOptionsByIp(const uint8_t * source_addr, size_t source_addr_length)
{
    StatsByIP x(source_addr, source_addr_length, false, false, false, false);
    StatsByIP * y = statsByIp.Retrieve(&x);

    if (y == NULL) {
        if (statsByIp.GetCount() < max_stats_by_ip_count) {
            bool stored = false;

            if ((y = statsByIp.InsertOrAdd(&x, true, &stored)) != NULL) {
                y->query_seen = true;
            }
        }
    } else {
        if (!y->query_seen) {
            y->count++;
            y->query_seen = true;
        }
    }

    if (y != NULL && is_using_edns && edns_options != NULL) {
        /* Should export the EDNS Options to new table. */
        uint32_t current_index = 0;
        while (current_index + 4 <= edns_options_length)
        {
            uint16_t o_code = (edns_options[current_index] << 8) | edns_options[current_index + 1];
            uint16_t o_length = (edns_options[current_index + 2] << 8) | edns_options[current_index + 3];
            bool should_export = y->RegisterNewOption(o_code);

            if (should_export) {
                SubmitRegistryNumber(REGISTRY_EDNS_OPT_USAGE, o_code);
            }
            current_index += 4 + o_length;
        }
    }
}